

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

size_t Catch::listTags(Config *config)

{
  bool bVar1;
  _Setw _Var2;
  ostream *poVar3;
  pointer pTVar4;
  reference pbVar5;
  pointer ppVar6;
  TextAttributes *pTVar7;
  size_t _value;
  ostream *poVar8;
  size_type sVar9;
  long *in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_TagInfo>_>::value,_pair<iterator,_bool>_>
  _Var10;
  Text wrapper;
  ostringstream oss;
  const_iterator countItEnd;
  const_iterator countIt_1;
  iterator countIt;
  string lcaseTagName;
  string tagName;
  const_iterator tagItEnd;
  const_iterator tagIt;
  const_iterator itEnd;
  const_iterator it;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> matchedTestCases;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
  tagCounts;
  TestSpec testSpec;
  pluralise *in_stack_fffffffffffffa38;
  TestSpecParser *in_stack_fffffffffffffa40;
  TestSpecParser *in_stack_fffffffffffffa48;
  TagInfo *in_stack_fffffffffffffa50;
  Text *in_stack_fffffffffffffa58;
  ostream *in_stack_fffffffffffffa60;
  allocator *paVar11;
  string *in_stack_fffffffffffffa68;
  TestSpecParser *in_stack_fffffffffffffa70;
  IConfig *in_stack_fffffffffffffa78;
  TestSpec *in_stack_fffffffffffffa80;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *in_stack_fffffffffffffa88;
  iterator in_stack_fffffffffffffab8;
  allocator local_519;
  string local_518 [72];
  string local_4d0 [32];
  string local_4b0 [32];
  TextAttributes local_490;
  string local_470 [80];
  TextAttributes *in_stack_fffffffffffffbe0;
  string *in_stack_fffffffffffffbe8;
  Text *in_stack_fffffffffffffbf0;
  ostringstream local_3f0 [376];
  iterator local_278;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>
  local_270;
  iterator local_268;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>
  local_260;
  _Base_ptr local_258;
  undefined1 local_250;
  _Base_ptr local_1b8;
  undefined1 local_1b0;
  _Self local_1a8;
  _Self local_1a0;
  string local_198 [32];
  string local_178 [32];
  _Self local_158;
  _Self local_150;
  TestCase *local_148;
  TestCase *local_138;
  __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
  local_130 [10];
  allocator local_d9;
  string local_d8 [208];
  long *local_8;
  
  local_8 = in_RDI;
  (**(code **)(*in_RDI + 0x68))();
  TestSpec::TestSpec((TestSpec *)in_stack_fffffffffffffa40,(TestSpec *)in_stack_fffffffffffffa38);
  (**(code **)(*local_8 + 0x68))();
  bVar1 = TestSpec::hasFilters((TestSpec *)0x1b1a38);
  if (bVar1) {
    poVar3 = cout();
    std::operator<<(poVar3,"Tags for matching test cases:\n");
  }
  else {
    poVar3 = cout();
    std::operator<<(poVar3,"All available tags:\n");
    ITagAliasRegistry::get();
    TestSpecParser::TestSpecParser
              (in_stack_fffffffffffffa40,(ITagAliasRegistry *)in_stack_fffffffffffffa38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,"*",&local_d9);
    TestSpecParser::parse(in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
    TestSpecParser::testSpec(in_stack_fffffffffffffa48);
    TestSpec::operator=((TestSpec *)in_stack_fffffffffffffa40,(TestSpec *)in_stack_fffffffffffffa38)
    ;
    TestSpec::~TestSpec((TestSpec *)0x1b1b2a);
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    TestSpecParser::~TestSpecParser(in_stack_fffffffffffffa40);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
         *)0x1b1bb6);
  getAllTestCasesSorted((IConfig *)0x1b1bc3);
  filterTests(in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  local_138 = (TestCase *)
              std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin
                        ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
                         in_stack_fffffffffffffa38);
  __gnu_cxx::
  __normal_iterator<Catch::TestCase_const*,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>>
  ::__normal_iterator<Catch::TestCase*>
            ((__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
              *)in_stack_fffffffffffffa40,
             (__normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
              *)in_stack_fffffffffffffa38);
  local_148 = (TestCase *)
              std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::end
                        ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
                         in_stack_fffffffffffffa38);
  __gnu_cxx::
  __normal_iterator<Catch::TestCase_const*,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>>
  ::__normal_iterator<Catch::TestCase*>
            ((__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
              *)in_stack_fffffffffffffa40,
             (__normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
              *)in_stack_fffffffffffffa38);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                             *)in_stack_fffffffffffffa40,
                            (__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                             *)in_stack_fffffffffffffa38), bVar1) {
    pTVar4 = __gnu_cxx::
             __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
             ::operator->(local_130);
    TestCase::getTestCaseInfo(pTVar4);
    local_150._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffa38);
    pTVar4 = __gnu_cxx::
             __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
             ::operator->(local_130);
    TestCase::getTestCaseInfo(pTVar4);
    local_158._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffa38);
    while (bVar1 = std::operator!=(&local_150,&local_158), bVar1) {
      pbVar5 = std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)0x1b1ce3);
      std::__cxx11::string::string(local_178,(string *)pbVar5);
      toLower(&in_stack_fffffffffffffa58->str);
      in_stack_fffffffffffffab8 =
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
           ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
                   *)in_stack_fffffffffffffa38,(key_type *)0x1b1d21);
      local_1a0._M_node = in_stack_fffffffffffffab8._M_node;
      local_1a8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
                  *)in_stack_fffffffffffffa38);
      bVar1 = std::operator==(&local_1a0,&local_1a8);
      if (bVar1) {
        TagInfo::TagInfo((TagInfo *)in_stack_fffffffffffffa40);
        std::make_pair<std::__cxx11::string&,Catch::TagInfo>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffa48,(TagInfo *)in_stack_fffffffffffffa40);
        _Var10 = std::
                 map<std::__cxx11::string,Catch::TagInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::TagInfo>>>
                 ::insert<std::pair<std::__cxx11::string,Catch::TagInfo>>
                           ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
                             *)in_stack_fffffffffffffa50,
                            (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>
                             *)in_stack_fffffffffffffa48);
        local_258 = (_Base_ptr)_Var10.first._M_node;
        local_250 = _Var10.second;
        local_1b8 = local_258;
        local_1b0 = local_250;
        local_1a0._M_node = local_258;
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>
                 *)in_stack_fffffffffffffa40);
        TagInfo::~TagInfo((TagInfo *)0x1b1e1c);
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>
                    *)0x1b1ed8);
      TagInfo::add(in_stack_fffffffffffffa50,(string *)in_stack_fffffffffffffa48);
      std::__cxx11::string::~string(local_198);
      std::__cxx11::string::~string(local_178);
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffffa40);
    }
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
    ::operator++(local_130);
  }
  local_268._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
                *)in_stack_fffffffffffffa38);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>
  ::_Rb_tree_const_iterator(&local_260,&local_268);
  local_278._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
              *)in_stack_fffffffffffffa38);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>
  ::_Rb_tree_const_iterator(&local_270,&local_278);
  while (bVar1 = std::operator!=(&local_260,&local_270), bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_3f0);
    poVar3 = std::operator<<((ostream *)local_3f0,"  ");
    _Var2 = std::setw(2);
    poVar3 = std::operator<<(poVar3,_Var2);
    ppVar6 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>
                           *)0x1b201f);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ppVar6->second).count);
    std::operator<<(poVar3,"  ");
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>
                  *)0x1b2054);
    TagInfo::all_abi_cxx11_((TagInfo *)in_stack_fffffffffffffab8._M_node);
    Tbc::TextAttributes::TextAttributes(&local_490);
    pTVar7 = Tbc::TextAttributes::setInitialIndent(&local_490,0);
    std::__cxx11::ostringstream::str();
    _value = std::__cxx11::string::size();
    pTVar7 = Tbc::TextAttributes::setIndent(pTVar7,_value);
    Tbc::TextAttributes::setWidth(pTVar7,0x46);
    Tbc::Text::Text(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
    std::__cxx11::string::~string(local_4b0);
    std::__cxx11::string::~string(local_470);
    poVar3 = cout();
    std::__cxx11::ostringstream::str();
    std::operator<<(poVar3,local_4d0);
    poVar3 = Tbc::operator<<(in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string(local_4d0);
    Tbc::Text::~Text((Text *)in_stack_fffffffffffffa40);
    std::__cxx11::ostringstream::~ostringstream(local_3f0);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>
                  *)in_stack_fffffffffffffa40);
  }
  poVar3 = cout();
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
  ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
          *)0x1b2275);
  paVar11 = &local_519;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_518,"tag",paVar11);
  pluralise::pluralise
            ((pluralise *)in_stack_fffffffffffffa40,(size_t)in_stack_fffffffffffffa38,
             (string *)0x1b22c1);
  poVar8 = operator<<((ostream *)in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
  poVar8 = std::operator<<(poVar8,"\n");
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  pluralise::~pluralise((pluralise *)0x1b2314);
  std::__cxx11::string::~string(local_518);
  std::allocator<char>::~allocator((allocator<char> *)&local_519);
  sVar9 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
          ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
                  *)0x1b233b);
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector
            ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)poVar3);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
          *)0x1b2359);
  TestSpec::~TestSpec((TestSpec *)0x1b2366);
  return sVar9;
}

Assistant:

inline std::size_t listTags( Config const& config ) {
        TestSpec testSpec = config.testSpec();
        if( config.testSpec().hasFilters() )
            Catch::cout() << "Tags for matching test cases:\n";
        else {
            Catch::cout() << "All available tags:\n";
            testSpec = TestSpecParser( ITagAliasRegistry::get() ).parse( "*" ).testSpec();
        }

        std::map<std::string, TagInfo> tagCounts;

        std::vector<TestCase> matchedTestCases = filterTests( getAllTestCasesSorted( config ), testSpec, config );
        for( std::vector<TestCase>::const_iterator it = matchedTestCases.begin(), itEnd = matchedTestCases.end();
                it != itEnd;
                ++it ) {
            for( std::set<std::string>::const_iterator  tagIt = it->getTestCaseInfo().tags.begin(),
                                                        tagItEnd = it->getTestCaseInfo().tags.end();
                    tagIt != tagItEnd;
                    ++tagIt ) {
                std::string tagName = *tagIt;
                std::string lcaseTagName = toLower( tagName );
                std::map<std::string, TagInfo>::iterator countIt = tagCounts.find( lcaseTagName );
                if( countIt == tagCounts.end() )
                    countIt = tagCounts.insert( std::make_pair( lcaseTagName, TagInfo() ) ).first;
                countIt->second.add( tagName );
            }
        }

        for( std::map<std::string, TagInfo>::const_iterator countIt = tagCounts.begin(),
                                                            countItEnd = tagCounts.end();
                countIt != countItEnd;
                ++countIt ) {
            std::ostringstream oss;
            oss << "  " << std::setw(2) << countIt->second.count << "  ";
            Text wrapper( countIt->second.all(), TextAttributes()
                                                    .setInitialIndent( 0 )
                                                    .setIndent( oss.str().size() )
                                                    .setWidth( CATCH_CONFIG_CONSOLE_WIDTH-10 ) );
            Catch::cout() << oss.str() << wrapper << "\n";
        }
        Catch::cout() << pluralise( tagCounts.size(), "tag" ) << "\n" << std::endl;
        return tagCounts.size();
    }